

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O2

void __thiscall
HEkkDualRow::chooseFinalLargeAlpha
          (HEkkDualRow *this,HighsInt *breakIndex,HighsInt *breakGroup,HighsInt pass_workCount,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pass_workData,
          vector<int,_std::allocator<int>_> *pass_workGroup)

{
  pointer piVar1;
  pointer piVar2;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar10 = 0;
  uVar8 = (ulong)(uint)pass_workCount;
  if (pass_workCount < 1) {
    uVar8 = uVar10;
  }
  dVar14 = 0.0;
  for (; uVar8 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
    dVar13 = *(double *)
              ((long)&((pass_workData->
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->second + uVar10);
    if (dVar13 <= dVar14) {
      dVar13 = dVar14;
    }
    dVar14 = dVar13;
  }
  dVar13 = 1.0;
  if (dVar14 * 0.1 <= 1.0) {
    dVar13 = dVar14 * 0.1;
  }
  piVar1 = (pass_workGroup->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (pass_workGroup->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *breakGroup = -1;
  *breakIndex = -1;
  uVar7 = (int)((ulong)((long)piVar2 - (long)piVar1) >> 2) - 2;
  ppVar3 = (pass_workData->
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if ((int)uVar7 < 0) {
      return;
    }
    lVar11 = (long)piVar1[uVar7];
    pdVar12 = &ppVar3[lVar11].second;
    iVar9 = -1;
    dVar14 = 0.0;
    for (; lVar11 < piVar1[(ulong)uVar7 + 1]; lVar11 = lVar11 + 1) {
      dVar15 = *pdVar12;
      iVar6 = (int)lVar11;
      if (dVar15 <= dVar14) {
        bVar4 = NAN(dVar15);
        bVar5 = dVar14 == dVar15;
        dVar15 = dVar14;
        iVar6 = iVar9;
        if (((bVar5) && (!NAN(dVar14) && !bVar4)) &&
           (iVar6 = (int)lVar11,
           this->workNumTotPermutation[ppVar3[iVar9].first] <=
           this->workNumTotPermutation[((pair<int,_double> *)(pdVar12 + -1))->first])) {
          iVar6 = iVar9;
        }
      }
      iVar9 = iVar6;
      pdVar12 = pdVar12 + 2;
      dVar14 = dVar15;
    }
    if (dVar13 < ppVar3[iVar9].second) break;
    uVar7 = uVar7 - 1;
  }
  *breakIndex = iVar9;
  *breakGroup = uVar7;
  return;
}

Assistant:

void HEkkDualRow::chooseFinalLargeAlpha(
    HighsInt& breakIndex, HighsInt& breakGroup, HighsInt pass_workCount,
    const std::vector<std::pair<HighsInt, double>>& pass_workData,
    const std::vector<HighsInt>& pass_workGroup) {
  double finalCompare = 0;
  for (HighsInt i = 0; i < pass_workCount; i++)
    finalCompare = max(finalCompare, pass_workData[i].second);
  finalCompare = min(0.1 * finalCompare, 1.0);
  HighsInt countGroup = pass_workGroup.size() - 1;
  breakGroup = -1;
  breakIndex = -1;
  for (HighsInt iGroup = countGroup - 1; iGroup >= 0; iGroup--) {
    double dMaxFinal = 0;
    HighsInt iMaxFinal = -1;
    for (HighsInt i = pass_workGroup[iGroup]; i < pass_workGroup[iGroup + 1];
         i++) {
      if (dMaxFinal < pass_workData[i].second) {
        dMaxFinal = pass_workData[i].second;
        iMaxFinal = i;
      } else if (dMaxFinal == pass_workData[i].second) {
        HighsInt jCol = pass_workData[iMaxFinal].first;
        HighsInt iCol = pass_workData[i].first;
        if (workNumTotPermutation[iCol] < workNumTotPermutation[jCol]) {
          iMaxFinal = i;
        }
      }
    }

    if (pass_workData[iMaxFinal].second > finalCompare) {
      breakIndex = iMaxFinal;
      breakGroup = iGroup;
      break;
    }
  }
}